

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  void *in_RDI;
  
  ~TestRunStats((TestRunStats *)0x128d68);
  operator_delete(in_RDI,0x68);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;